

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::printIncrementalStats(Solver *this)

{
  puts("c---------- Glucose Stats -------------------------");
  printf("c restarts              : %lu\n",this->starts);
  printf("c nb ReduceDB           : %lu\n",(this->stats).data[0xd]);
  printf("c nb removed Clauses    : %lu\n",(this->stats).data[7]);
  printf("c nb learnts DL2        : %lu\n",(this->stats).data[10]);
  printf("c nb learnts size 2     : %lu\n",(this->stats).data[0xb]);
  printf("c nb learnts size 1     : %lu\n",(this->stats).data[0xc]);
  printf("c conflicts             : %lu\n",this->conflicts);
  printf("c decisions             : %lu\n",this->decisions);
  printf("c propagations          : %lu\n",this->propagations);
  printf("\nc SAT Calls             : %d in %g seconds\n",this->totalTime4Sat,
         (ulong)(uint)this->nbSatCalls);
  printf("c UNSAT Calls           : %d in %g seconds\n",this->totalTime4Unsat,
         (ulong)(uint)this->nbUnsatCalls);
  puts("c--------------------------------------------------");
  return;
}

Assistant:

void Solver::printIncrementalStats() {

    printf("c---------- Glucose Stats -------------------------\n");
    printf("c restarts              : %"
    PRIu64
    "\n", starts);
    printf("c nb ReduceDB           : %"
    PRIu64
    "\n", stats[nbReduceDB]);
    printf("c nb removed Clauses    : %"
    PRIu64
    "\n", stats[nbRemovedClauses]);
    printf("c nb learnts DL2        : %"
    PRIu64
    "\n", stats[nbDL2]);
    printf("c nb learnts size 2     : %"
    PRIu64
    "\n", stats[nbBin]);
    printf("c nb learnts size 1     : %"
    PRIu64
    "\n", stats[nbUn]);

    printf("c conflicts             : %"
    PRIu64
    "\n", conflicts);
    printf("c decisions             : %"
    PRIu64
    "\n", decisions);
    printf("c propagations          : %"
    PRIu64
    "\n", propagations);

    printf("\nc SAT Calls             : %d in %g seconds\n", nbSatCalls, totalTime4Sat);
    printf("c UNSAT Calls           : %d in %g seconds\n", nbUnsatCalls, totalTime4Unsat);

    printf("c--------------------------------------------------\n");
}